

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * Json::duplicateStringValue(char *value,size_t length)

{
  ulong in_RSI;
  void *in_RDI;
  char *newString;
  string *in_stack_ffffffffffffffc0;
  string local_38 [32];
  char *local_18;
  ulong local_10;
  void *local_8;
  
  local_10 = in_RSI;
  if (0x7ffffffe < in_RSI) {
    local_10 = 0x7ffffffe;
  }
  local_8 = in_RDI;
  local_18 = (char *)malloc(local_10 + 1);
  if (local_18 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer",
               (allocator *)&stack0xffffffffffffffc7);
    throwRuntimeError(in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  memcpy(local_18,local_8,local_10);
  local_18[local_10] = '\0';
  return local_18;
}

Assistant:

static inline char* duplicateStringValue(const char* value,
                                         size_t length) {
  // Avoid an integer overflow in the call to malloc below by limiting length
  // to a sane value.
  if (length >= (size_t)Value::maxInt)
    length = Value::maxInt - 1;

  char* newString = static_cast<char*>(malloc(length + 1));
  if (newString == NULL) {
    throwRuntimeError(
        "in Json::Value::duplicateStringValue(): "
        "Failed to allocate string value buffer");
  }
  memcpy(newString, value, length);
  newString[length] = 0;
  return newString;
}